

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_optional.hpp
# Opt level: O2

void __thiscall
ak_toolbox::compact_optional_ns::detail_::buffer_storage<evp_minutes>::operator=
          (buffer_storage<evp_minutes> *this,buffer_storage<evp_minutes> *rhs)

{
  int iVar1;
  
  iVar1 = rhs->value_;
  if (this->value_ == -1) {
    if (iVar1 != -1) {
      minutes_since_midnight::minutes_since_midnight
                ((minutes_since_midnight *)this,(minutes_since_midnight *)rhs);
      return;
    }
  }
  else {
    if (iVar1 == -1) {
      destroy(this);
      return;
    }
    this->value_ = iVar1;
  }
  return;
}

Assistant:

void operator=(buffer_storage&& rhs)
    {
      if (has_value() && rhs.has_value())
      {
        as_value_type() = std::move(rhs.as_value_type());
      }
      else if (has_value() && !rhs.has_value())
      {
        destroy();
      }
      else if (!has_value() && rhs.has_value())
      {
        construct(std::move(rhs.as_value_type()));
      }
    }